

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmidl.c
# Opt level: O0

_Bool tmidl_parser_parse(tmidl_parser_o *parser,char *input,tmidl_callbacks_i *callbacks,
                        void *user_context)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  c_item_t *item;
  int i;
  c_item_t **items;
  util_array_t *array;
  tmidl_diagnostic_t diagnostic;
  char *message;
  mpc_result_t mStack_38;
  _Bool success;
  mpc_result_t r;
  void *user_context_local;
  tmidl_callbacks_i *callbacks_local;
  char *input_local;
  tmidl_parser_o *parser_local;
  
  r = (mpc_result_t)user_context;
  user_context_local = callbacks;
  callbacks_local = (tmidl_callbacks_i *)input;
  input_local = (char *)parser;
  iVar3 = mpc_parse("input",input,parser->module_parser,&stack0xffffffffffffffc8);
  if (iVar3 == 0) {
    diagnostic._0_8_ = mpc_err_string(mStack_38.error);
    array._0_4_ = 1;
    diagnostic.message._0_4_ = (undefined4)((mStack_38.error)->state).pos;
    diagnostic.message._4_4_ = (int)((mStack_38.error)->state).pos + 1;
    diagnostic._16_8_ = diagnostic._0_8_;
    (**(code **)((long)user_context_local + 0x10))(&array,r.error);
    free((void *)diagnostic._16_8_);
    mpc_err_delete(mStack_38.error);
    parser_local._7_1_ = false;
  }
  else {
    lVar1 = ((mStack_38.error)->state).pos;
    for (item._4_4_ = 0; item._4_4_ < (int)((mStack_38.error)->state).row;
        item._4_4_ = item._4_4_ + 1) {
      piVar2 = *(int **)(lVar1 + (long)item._4_4_ * 8);
      if (*piVar2 == 0) {
        handle_declaration(*(c_declaration_t **)(piVar2 + 2),(tmidl_callbacks_i *)user_context_local
                           ,r.output);
      }
      else if (*piVar2 == 1) {
        (**(code **)((long)user_context_local + 8))(*(undefined8 *)(piVar2 + 2),r.error);
      }
    }
    free_items(mStack_38.output);
    parser_local._7_1_ = true;
  }
  return parser_local._7_1_;
}

Assistant:

bool tmidl_parser_parse(
    tmidl_parser_o *parser,
    const char *input,
    const tmidl_callbacks_i *callbacks,
    void *user_context)
{
    // Parse the input
    mpc_result_t r;
    bool success = mpc_parse("input", input, parser->module_parser, &r);

    if (!success) {
        char *message = mpc_err_string(r.error);

        tmidl_diagnostic_t diagnostic;
        diagnostic.level = TMIDL_LEVEL_ERROR;
        diagnostic.message = message;
        diagnostic.position_start = r.error->state.pos;
        diagnostic.position_end = r.error->state.pos + 1;
        callbacks->on_diagnostic(&diagnostic, user_context);

        free(message);
        mpc_err_delete(r.error);
        return false;
    }

    // Pass items to caller
    util_array_t *array = r.output;
    c_item_t **items = array->ptr;

    for (int i = 0; i < array->count; i++) {
        c_item_t *item = items[i];

        switch (item->type) {
        case C_ITEM_TYPE_DECLARATION:
            handle_declaration(((c_item_declaration_t *)item)->declaration, callbacks, user_context);
            break;
        case C_ITEM_TYPE_MODULE_DOC:
            callbacks->on_module_doc(((c_item_module_doc_t *)item)->doc, user_context);
            break;
        }
    }

    // Clean up the parsed items
    free_items(array);

    return true;
}